

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GraphicsAccessories.cpp
# Opt level: O1

Char * Diligent::GetTextureAddressModeLiteralName
                 (TEXTURE_ADDRESS_MODE AddressMode,bool bGetFullName)

{
  char *pcVar1;
  char *pcVar2;
  undefined7 in_register_00000039;
  char (*in_R8) [2];
  string msg;
  uint local_2c;
  string local_28;
  
  switch(CONCAT71(in_register_00000039,AddressMode) & 0xffffffff) {
  case 0:
    pcVar2 = "TEXTURE_ADDRESS_UNKNOWN";
    pcVar1 = "unknown";
    break;
  case 1:
    pcVar2 = "TEXTURE_ADDRESS_WRAP";
    pcVar1 = "wrap";
    break;
  case 2:
    pcVar2 = "TEXTURE_ADDRESS_MIRROR";
    pcVar1 = "mirror";
    break;
  case 3:
    pcVar2 = "TEXTURE_ADDRESS_CLAMP";
    pcVar1 = "clamp";
    break;
  case 4:
    pcVar2 = "TEXTURE_ADDRESS_BORDER";
    pcVar1 = "border";
    break;
  case 5:
    pcVar2 = "TEXTURE_ADDRESS_MIRROR_ONCE";
    pcVar1 = "mirror once";
    break;
  default:
    local_2c = (uint)AddressMode;
    FormatString<char[34],unsigned_int,char[2]>
              (&local_28,(Diligent *)"Unexpected texture address mode (",(char (*) [34])&local_2c,
               (uint *)0x33e49a,in_R8);
    DebugAssertionFailed
              (local_28._M_dataplus._M_p,"GetTextureAddressModeLiteralName",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsAccessories/src/GraphicsAccessories.cpp"
               ,0x39d);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_28._M_dataplus._M_p != &local_28.field_2) {
      operator_delete(local_28._M_dataplus._M_p,local_28.field_2._M_allocated_capacity + 1);
    }
    return "UNKNOWN";
  }
  if (bGetFullName) {
    pcVar1 = pcVar2;
  }
  return pcVar1;
}

Assistant:

const Char* GetTextureAddressModeLiteralName(TEXTURE_ADDRESS_MODE AddressMode, bool bGetFullName)
{
    static_assert(TEXTURE_ADDRESS_NUM_MODES == 6, "Please update the switch below to handle the new texture address mode");
    switch (AddressMode)
    {
        // clang-format off
        case TEXTURE_ADDRESS_UNKNOWN:     return bGetFullName ? "TEXTURE_ADDRESS_UNKNOWN"     : "unknown";
        case TEXTURE_ADDRESS_WRAP:        return bGetFullName ? "TEXTURE_ADDRESS_WRAP"        : "wrap";
        case TEXTURE_ADDRESS_MIRROR:      return bGetFullName ? "TEXTURE_ADDRESS_MIRROR"      : "mirror";
        case TEXTURE_ADDRESS_CLAMP:       return bGetFullName ? "TEXTURE_ADDRESS_CLAMP"       : "clamp";
        case TEXTURE_ADDRESS_BORDER:      return bGetFullName ? "TEXTURE_ADDRESS_BORDER"      : "border";
        case TEXTURE_ADDRESS_MIRROR_ONCE: return bGetFullName ? "TEXTURE_ADDRESS_MIRROR_ONCE" : "mirror once";
        // clang-format on
        default:
            UNEXPECTED("Unexpected texture address mode (", Uint32{AddressMode}, ")");
            return "UNKNOWN";
    }
}